

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

uint8_t opcode_numop(opcode_t op)

{
  uint8_t local_9;
  opcode_t op_local;
  
  switch(op) {
  case RET0:
    local_9 = '\0';
    break;
  case HALT:
    local_9 = '\0';
    break;
  case NOP:
    local_9 = '\0';
    break;
  case RET:
    local_9 = '\x01';
    break;
  case CALL:
    local_9 = '\x03';
    break;
  case LOAD:
    local_9 = '\x03';
    break;
  case LOADS:
    local_9 = '\x03';
    break;
  case LOADAT:
    local_9 = '\x03';
    break;
  case LOADK:
    local_9 = '\x02';
    break;
  case LOADG:
    local_9 = '\x02';
    break;
  case LOADI:
    local_9 = '\x02';
    break;
  case LOADU:
    local_9 = '\x02';
    break;
  case MOVE:
    local_9 = '\x02';
    break;
  case STORE:
    local_9 = '\x03';
    break;
  case STOREAT:
    local_9 = '\x03';
    break;
  case STOREG:
    local_9 = '\x02';
    break;
  case STOREU:
    local_9 = '\x02';
    break;
  case JUMP:
    local_9 = '\x01';
    break;
  case JUMPF:
    local_9 = '\x02';
    break;
  case SWITCH:
    local_9 = '\x01';
    break;
  case ADD:
    local_9 = '\x03';
    break;
  case SUB:
    local_9 = '\x03';
    break;
  case DIV:
    local_9 = '\x03';
    break;
  case MUL:
    local_9 = '\x03';
    break;
  case REM:
    local_9 = '\x03';
    break;
  case AND:
    local_9 = '\x03';
    break;
  case OR:
    local_9 = '\x03';
    break;
  case LT:
    local_9 = '\x03';
    break;
  case GT:
    local_9 = '\x03';
    break;
  case EQ:
    local_9 = '\x03';
    break;
  case LEQ:
    local_9 = '\x03';
    break;
  case GEQ:
    local_9 = '\x03';
    break;
  case NEQ:
    local_9 = '\x03';
    break;
  case EQQ:
    local_9 = '\x03';
    break;
  case NEQQ:
    local_9 = '\x03';
    break;
  case ISA:
    local_9 = '\x03';
    break;
  case MATCH:
    local_9 = '\x03';
    break;
  case NEG:
    local_9 = '\x02';
    break;
  case NOT:
    local_9 = '\x02';
    break;
  case LSHIFT:
    local_9 = '\x03';
    break;
  case RSHIFT:
    local_9 = '\x03';
    break;
  case BAND:
    local_9 = '\x03';
    break;
  case BOR:
    local_9 = '\x03';
    break;
  case BXOR:
    local_9 = '\x03';
    break;
  case BNOT:
    local_9 = '\x02';
    break;
  case MAPNEW:
    local_9 = '\x02';
    break;
  case LISTNEW:
    local_9 = '\x02';
    break;
  case RANGENEW:
    local_9 = '\x03';
    break;
  case SETLIST:
    local_9 = '\x03';
    break;
  case CLOSURE:
    local_9 = '\x02';
    break;
  case CLOSE:
    local_9 = '\x01';
    break;
  case CHECK:
    local_9 = '\x01';
    break;
  case RESERVED2:
  case RESERVED3:
  case RESERVED4:
  case RESERVED5:
  case RESERVED6:
    local_9 = '\0';
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_ircode.c"
                  ,0x105,"uint8_t opcode_numop(opcode_t)");
  }
  return local_9;
}

Assistant:

uint8_t opcode_numop (opcode_t op) {
    switch (op) {
        case HALT: return 0;
        case NOP: return 0;
        case RET0: return 0;
        case RET: return 1;
        case CALL: return 3;
        case SETLIST: return 3;
        case LOADK: return 2;
        case LOADG: return 2;
        case LOADI: return 2;
        case LOADAT: return 3;
        case LOADS: return 3;
        case LOAD: return 3;
        case LOADU: return 2;
        case MOVE: return 2;
        case STOREG: return 2;
        case STOREAT: return 3;
        case STORE: return 3;
        case STOREU: return 2;
        case JUMP: return 1;
        case JUMPF: return 2;
        case SWITCH: return 1;
        case ADD: return 3;
        case SUB: return 3;
        case DIV: return 3;
        case MUL: return 3;
        case REM: return 3;
        case AND: return 3;
        case OR: return 3;
        case LT: return 3;
        case GT: return 3;
        case EQ: return 3;
        case ISA: return 3;
        case MATCH: return 3;
        case EQQ: return 3;
        case LEQ: return 3;
        case GEQ: return 3;
        case NEQ: return 3;
        case NEQQ: return 3;
        case NEG: return 2;
        case NOT: return 2;
        case LSHIFT: return 3;
        case RSHIFT: return 3;
        case BAND: return 3;
        case BOR: return 3;
        case BXOR: return 3;
        case BNOT: return 2;
        case MAPNEW: return 2;
        case LISTNEW: return 2;
        case RANGENEW: return 3;
        case CLOSURE: return 2;
        case CLOSE: return 1;
        case CHECK: return 1;
        case RESERVED2:
        case RESERVED3:
        case RESERVED4:
        case RESERVED5:
        case RESERVED6: return 0;
    }

    assert(0);
    return 0;
}